

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::
OP_InitUndeclLocalConstProperty<Js::OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)2>>const__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout)

{
  PropertyId propertyId;
  
  propertyId = GetPropertyIdFromCacheId(this,playout->inlineCacheIndex);
  JavascriptOperators::OP_InitConstProperty
            (*(Var *)(this + 0x58),propertyId,
             *(Var *)(*(long *)(*(long *)(this + 0x78) + 8) + 0x4f8));
  return;
}

Assistant:

void InterpreterStackFrame::OP_InitUndeclLocalConstProperty(unaligned T* playout)
    {
        PropertyId propertyId = GetPropertyIdFromCacheId(playout->inlineCacheIndex);
        JavascriptOperators::OP_InitConstProperty(this->localClosure, propertyId, this->scriptContext->GetLibrary()->GetUndeclBlockVar());
    }